

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O3

Status __thiscall
leveldb::DoWriteStringToFile(leveldb *this,Env *env,Slice *data,string *fname,bool should_sync)

{
  int iVar1;
  undefined4 extraout_var;
  Status SVar2;
  char *extraout_RAX;
  undefined4 extraout_var_00;
  char *extraout_RAX_00;
  char *pcVar3;
  WritableFile *file;
  char *local_40;
  long *local_38;
  void *local_30;
  
  iVar1 = (*env->_vptr_Env[4])(this,env,fname,&local_38);
  SVar2.state_ = (char *)CONCAT44(extraout_var,iVar1);
  if (*(long *)this == 0) {
    (**(code **)(*local_38 + 0x10))(&local_40,local_38,data);
    SVar2.state_ = *(char **)this;
    pcVar3 = local_40;
    if (SVar2.state_ != local_40) {
      if (SVar2.state_ != (char *)0x0) {
        operator_delete__(SVar2.state_);
      }
      if (local_40 == (char *)0x0) {
        pcVar3 = (char *)0x0;
        SVar2.state_ = (char *)0x0;
      }
      else {
        SVar2.state_ = Status::CopyState(local_40);
        pcVar3 = local_40;
      }
      *(char **)this = SVar2.state_;
    }
    if (pcVar3 != (char *)0x0) {
      operator_delete__(pcVar3);
      SVar2.state_ = *(char **)this;
    }
    if (should_sync && SVar2.state_ == (char *)0x0) {
      (**(code **)(*local_38 + 0x28))(&local_40);
      SVar2.state_ = *(char **)this;
      pcVar3 = local_40;
      if (SVar2.state_ != local_40) {
        if (SVar2.state_ != (char *)0x0) {
          operator_delete__(SVar2.state_);
        }
        if (local_40 == (char *)0x0) {
          pcVar3 = (char *)0x0;
          SVar2.state_ = (char *)0x0;
        }
        else {
          SVar2.state_ = Status::CopyState(local_40);
          pcVar3 = local_40;
        }
        *(char **)this = SVar2.state_;
      }
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
        SVar2.state_ = *(char **)this;
      }
    }
    if (SVar2.state_ == (char *)0x0) {
      (**(code **)(*local_38 + 0x18))(&local_40);
      SVar2.state_ = *(char **)this;
      if (SVar2.state_ != local_40) {
        if (SVar2.state_ != (char *)0x0) {
          operator_delete__(SVar2.state_);
        }
        if (local_40 == (char *)0x0) {
          local_40 = (char *)0x0;
          SVar2.state_ = (char *)0x0;
        }
        else {
          SVar2.state_ = Status::CopyState(local_40);
        }
        *(char **)this = SVar2.state_;
      }
      if (local_40 != (char *)0x0) {
        operator_delete__(local_40);
        SVar2.state_ = extraout_RAX;
      }
    }
    if (local_38 != (long *)0x0) {
      SVar2.state_ = (char *)(**(code **)(*local_38 + 8))();
    }
    if (*(long *)this != 0) {
      iVar1 = (*env->_vptr_Env[8])(&local_30,env,fname);
      SVar2.state_ = (char *)CONCAT44(extraout_var_00,iVar1);
      if (local_30 != (void *)0x0) {
        operator_delete__(local_30);
        SVar2.state_ = extraout_RAX_00;
      }
    }
  }
  return (Status)SVar2.state_;
}

Assistant:

static Status DoWriteStringToFile(Env *env, const Slice &data,
                                      const std::string &fname,
                                      bool should_sync) {
        WritableFile *file;
        Status s = env->NewWritableFile(fname, &file);
        if (!s.ok()) {
            return s;
        }
        s = file->Append(data);
        if (s.ok() && should_sync) {
            s = file->Sync();
        }
        if (s.ok()) {
            s = file->Close();
        }
        delete file;  // Will auto-close if we did not close above
        if (!s.ok()) {
            env->DeleteFile(fname);
        }
        return s;
    }